

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * Fantasy_Movie_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  size_t n_1;
  char *pcVar5;
  ulong uVar6;
  flatcc_json_parser_integral_symbol_f **type_parsers;
  ulong uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar8;
  uint uVar12;
  flatbuffers_voffset_t fVar13;
  ulong *puVar14;
  ulong *puVar15;
  byte *pbVar16;
  size_t h_unions;
  int more;
  flatcc_builder_ref_t *local_38;
  
  *result = 0;
  iVar3 = flatcc_builder_start_table(ctx->ctx,10);
  if ((iVar3 != 0) ||
     (pcVar5 = flatcc_json_parser_prepare_unions(ctx,buf,end,5,&h_unions), pcVar5 == end))
  goto LAB_00117730;
  if ((buf == end) || (*buf != '{')) {
    more = 0;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
  }
  else {
    puVar14 = (ulong *)(buf + 1);
    if ((long)end - (long)puVar14 < 2) {
LAB_001177ca:
      puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
    }
    else if ((char)(byte)*puVar14 < '!') {
      if (((byte)*puVar14 != 0x20) || (buf[2] < '!')) goto LAB_001177ca;
      puVar14 = (ulong *)(buf + 2);
    }
    if ((puVar14 == (ulong *)end) || ((byte)*puVar14 != 0x7d)) {
      more = 1;
      buf = (char *)puVar14;
    }
    else {
      more = 0;
      buf = (char *)((long)puVar14 + 1);
      if ((long)end - (long)buf < 2) {
LAB_00118a2f:
        buf = flatcc_json_parser_space_ext(ctx,buf,end);
      }
      else if (*buf < '!') {
        if ((*buf != 0x20) || ((char)*(byte *)((long)puVar14 + 2) < '!')) goto LAB_00118a2f;
        buf = (char *)((long)puVar14 + 2);
      }
    }
  }
  local_38 = result;
  if (more != 0) {
    do {
      if (buf != end) {
        if ((byte)*(ulong *)buf == 0x2e) {
          buf = flatcc_json_parser_set_error(ctx,buf,end,5);
        }
        else if ((byte)*(ulong *)buf == 0x22) {
          buf = (char *)((long)buf + 1);
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      uVar7 = (long)end - (long)buf;
      if (uVar7 < 8) {
        uVar6 = 0;
        switch(uVar7) {
        case 7:
          uVar6 = (long)(char)*(byte *)((long)buf + 6) << 8;
        case 6:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
        case 5:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
        case 4:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
        case 3:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
        case 2:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
        case 1:
          uVar6 = uVar6 | (ulong)(byte)*(ulong *)buf << 0x38;
        }
      }
      else {
        uVar6 = *(ulong *)buf;
        uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
      }
      puVar14 = (ulong *)buf;
      if (uVar6 < 0x6368617261637465) {
        if (uVar6 == 0x63616d656f5f7479) {
          puVar1 = (ulong *)((long)buf + 8);
          uVar7 = (long)end - (long)puVar1;
          if (uVar7 < 8) {
            uVar6 = 0;
            switch(uVar7) {
            case 7:
              uVar6 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
            case 6:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xd) << 0x10;
            case 5:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xc) << 0x18;
            case 4:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xb) << 0x20;
            case 3:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 10) << 0x28;
            case 2:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 9) << 0x30;
            case 1:
              uVar6 = uVar6 | (ulong)(byte)*puVar1 << 0x38;
            }
          }
          else {
            uVar6 = (*puVar1 & 0xff00) << 0x28 | *puVar1 << 0x38;
          }
          puVar14 = puVar1;
          if ((uVar6 & 0xffff000000000000) != 0x7065000000000000) goto LAB_001189b6;
          if (2 < (long)uVar7) {
            bVar2 = *(byte *)((long)buf + 10);
            if (ctx->unquoted == 0) {
              if (bVar2 == 0x22) {
                pbVar16 = (byte *)((long)buf + 0xb);
                goto LAB_001180df;
              }
            }
            else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
              pbVar16 = (byte *)((long)buf + 10);
              ctx->unquoted = 0;
LAB_001180df:
              if ((long)end - (long)pbVar16 < 2) {
LAB_001181c3:
                pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
              }
              else if ((char)*pbVar16 < '!') {
                if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_001181c3;
                pbVar16 = pbVar16 + 1;
              }
              if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
              }
              else {
                puVar14 = (ulong *)(pbVar16 + 1);
                if ((long)end - (long)puVar14 < 2) {
LAB_0011855f:
                  puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                }
                else if ((char)(byte)*puVar14 < '!') {
                  if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_0011855f;
                  puVar14 = (ulong *)(pbVar16 + 2);
                }
              }
            }
          }
          if (puVar1 != puVar14) {
            sVar8 = 3;
            fVar13 = 7;
            type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_1;
            goto LAB_0011896c;
          }
          goto LAB_001189b6;
        }
        if (uVar6 == 0x616e7461676f6e69) {
          puVar1 = (ulong *)((long)buf + 8);
          uVar7 = (long)end - (long)puVar1;
          if (uVar7 < 8) {
            uVar6 = 0;
            switch(uVar7) {
            case 7:
              uVar6 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
            case 6:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xd) << 0x10;
            case 5:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xc) << 0x18;
            case 4:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xb) << 0x20;
            case 3:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 10) << 0x28;
            case 2:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 9) << 0x30;
            case 1:
              uVar6 = uVar6 | (ulong)(byte)*puVar1 << 0x38;
            }
          }
          else {
            uVar6 = *puVar1;
            uVar6 = (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
                    (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
                    (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
          }
          puVar14 = puVar1;
          if (uVar6 != 0x73745f7479706500) {
            if ((uVar6 & 0xffff000000000000) != 0x7374000000000000) goto LAB_001189b6;
            if (2 < (long)uVar7) {
              bVar2 = *(byte *)((long)buf + 10);
              if (ctx->unquoted == 0) {
                if (bVar2 == 0x22) {
                  pbVar16 = (byte *)((long)buf + 0xb);
                  goto LAB_00118346;
                }
              }
              else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                pbVar16 = (byte *)((long)buf + 10);
                ctx->unquoted = 0;
LAB_00118346:
                if ((long)end - (long)pbVar16 < 2) {
LAB_001183a2:
                  pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
                }
                else if ((char)*pbVar16 < '!') {
                  if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_001183a2;
                  pbVar16 = pbVar16 + 1;
                }
                if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                  puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
                }
                else {
                  puVar14 = (ulong *)(pbVar16 + 1);
                  if ((long)end - (long)puVar14 < 2) {
LAB_00118852:
                    puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                  }
                  else if ((char)(byte)*puVar14 < '!') {
                    if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_00118852;
                    puVar14 = (ulong *)(pbVar16 + 2);
                  }
                }
              }
            }
            if (puVar1 != puVar14) {
              sVar8 = 1;
              fVar13 = 3;
              goto LAB_001189a0;
            }
            goto LAB_001189b6;
          }
          if (7 < (long)uVar7) {
            bVar2 = *(byte *)((long)buf + 0xf);
            if (ctx->unquoted == 0) {
              if (bVar2 == 0x22) {
                puVar15 = (ulong *)((long)buf + 0x10);
                goto LAB_0011809c;
              }
            }
            else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
              puVar15 = (ulong *)((long)buf + 0xf);
              ctx->unquoted = 0;
LAB_0011809c:
              if ((long)end - (long)puVar15 < 2) {
LAB_00118154:
                puVar15 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar15,end);
              }
              else if ((char)(byte)*puVar15 < '!') {
                if (((byte)*puVar15 != 0x20) || ((char)*(byte *)((long)puVar15 + 1) < '!'))
                goto LAB_00118154;
                puVar15 = (ulong *)((long)puVar15 + 1);
              }
              if ((puVar15 == (ulong *)end) || ((byte)*puVar15 != 0x3a)) {
                puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar15,end,4);
              }
              else {
                puVar14 = (ulong *)((long)puVar15 + 1);
                if ((long)end - (long)puVar14 < 2) {
LAB_0011851f:
                  puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                }
                else if ((char)*(byte *)puVar14 < '!') {
                  if ((*(byte *)puVar14 != 0x20) || ((char)*(byte *)((long)puVar15 + 2) < '!'))
                  goto LAB_0011851f;
                  puVar14 = (ulong *)((long)puVar15 + 2);
                }
              }
            }
          }
          if (puVar1 == puVar14) goto LAB_001189b6;
          sVar8 = 1;
          fVar13 = 3;
          type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers;
LAB_0011896c:
          pcVar5 = flatcc_json_parser_union_type
                             (ctx,(char *)puVar14,end,sVar8,fVar13,h_unions,type_parsers,
                              Fantasy_Character_parse_json_union);
        }
        else {
          if ((uVar6 & 0x7fffffffff000000) != 0x63616d656f000000) goto LAB_001189b6;
          if (5 < (long)uVar7) {
            bVar2 = *(byte *)((long)buf + 5);
            if (ctx->unquoted == 0) {
              if (bVar2 == 0x22) {
                pbVar16 = (byte *)((long)buf + 6);
                goto LAB_00118123;
              }
            }
            else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
              pbVar16 = (byte *)((long)buf + 5);
              ctx->unquoted = 0;
LAB_00118123:
              if ((long)end - (long)pbVar16 < 2) {
LAB_00118232:
                pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
              }
              else if ((char)*pbVar16 < '!') {
                if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_00118232;
                pbVar16 = pbVar16 + 1;
              }
              if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
              }
              else {
                puVar14 = (ulong *)(pbVar16 + 1);
                if ((long)end - (long)puVar14 < 2) {
LAB_0011859f:
                  puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                }
                else if ((char)(byte)*puVar14 < '!') {
                  if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_0011859f;
                  puVar14 = (ulong *)(pbVar16 + 2);
                }
              }
            }
          }
          if ((ulong *)buf == puVar14) goto LAB_001189b6;
          sVar8 = 3;
          fVar13 = 7;
LAB_001189a0:
          pcVar5 = flatcc_json_parser_union
                             (ctx,(char *)puVar14,end,sVar8,fVar13,h_unions,
                              Fantasy_Character_parse_json_union);
        }
      }
      else {
        if (uVar6 < 0x6d61696e5f636861) {
          if (uVar6 == 0x6368617261637465) {
            puVar1 = (ulong *)((long)buf + 8);
            uVar7 = (long)end - (long)puVar1;
            if (uVar7 < 8) {
              uVar6 = 0;
              switch(uVar7) {
              case 7:
                uVar6 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
              case 6:
                uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xd) << 0x10;
              case 5:
                uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xc) << 0x18;
              case 4:
                uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xb) << 0x20;
              case 3:
                uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 10) << 0x28;
              case 2:
                uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 9) << 0x30;
              case 1:
                uVar6 = uVar6 | (ulong)(byte)*puVar1 << 0x38;
              }
            }
            else {
              uVar6 = *puVar1;
              uVar6 = (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
                      (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
                      (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
            }
            puVar14 = puVar1;
            if (uVar6 == 0x72735f7479706500) {
              if (7 < (long)uVar7) {
                bVar2 = *(byte *)((long)buf + 0xf);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    puVar15 = (ulong *)((long)buf + 0x10);
                    goto LAB_001182a7;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  puVar15 = (ulong *)((long)buf + 0xf);
                  ctx->unquoted = 0;
LAB_001182a7:
                  if ((long)end - (long)puVar15 < 2) {
LAB_001182c8:
                    puVar15 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar15,end);
                  }
                  else if ((char)(byte)*puVar15 < '!') {
                    if (((byte)*puVar15 != 0x20) || ((char)*(byte *)((long)puVar15 + 1) < '!'))
                    goto LAB_001182c8;
                    puVar15 = (ulong *)((long)puVar15 + 1);
                  }
                  if ((puVar15 == (ulong *)end) || ((byte)*puVar15 != 0x3a)) {
                    puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar15,end,4);
                  }
                  else {
                    puVar14 = (ulong *)((long)puVar15 + 1);
                    if ((long)end - (long)puVar14 < 2) {
LAB_001187fc:
                      puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                    }
                    else if ((char)*(byte *)puVar14 < '!') {
                      if ((*(byte *)puVar14 != 0x20) || ((char)*(byte *)((long)puVar15 + 2) < '!'))
                      goto LAB_001187fc;
                      puVar14 = (ulong *)((long)puVar15 + 2);
                    }
                  }
                }
              }
              if (puVar1 != puVar14) {
                pcVar5 = flatcc_json_parser_union_type_vector
                                   (ctx,(char *)puVar14,end,4,9,h_unions,
                                    Fantasy_Movie_parse_json_table::symbolic_parsers_2,
                                    Fantasy_Character_parse_json_union,
                                    Fantasy_Character_json_union_accept_type);
                goto LAB_001189be;
              }
            }
            else if ((uVar6 & 0xffff000000000000) == 0x7273000000000000) {
              if (2 < (long)uVar7) {
                bVar2 = *(byte *)((long)buf + 10);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    pbVar16 = (byte *)((long)buf + 0xb);
                    goto LAB_0011848f;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  pbVar16 = (byte *)((long)buf + 10);
                  ctx->unquoted = 0;
LAB_0011848f:
                  if ((long)end - (long)pbVar16 < 2) {
LAB_001184b0:
                    pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
                  }
                  else if ((char)*pbVar16 < '!') {
                    if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_001184b0;
                    pbVar16 = pbVar16 + 1;
                  }
                  if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                    puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
                  }
                  else {
                    puVar14 = (ulong *)(pbVar16 + 1);
                    if ((long)end - (long)puVar14 < 2) {
LAB_001188c7:
                      puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                    }
                    else if ((char)(byte)*puVar14 < '!') {
                      if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_001188c7;
                      puVar14 = (ulong *)(pbVar16 + 2);
                    }
                  }
                }
              }
              if (puVar1 != puVar14) {
                pcVar5 = flatcc_json_parser_union_vector
                                   (ctx,(char *)puVar14,end,4,9,h_unions,
                                    Fantasy_Character_parse_json_union);
                goto LAB_001189be;
              }
            }
          }
        }
        else if (uVar6 == 0x736964655f6b6963) {
          puVar1 = (ulong *)((long)buf + 8);
          uVar7 = (long)end - (long)puVar1;
          if (uVar7 < 8) {
            uVar6 = 0;
            switch(uVar7) {
            case 7:
              uVar6 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
            case 6:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xd) << 0x10;
            case 5:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xc) << 0x18;
            case 4:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xb) << 0x20;
            case 3:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 10) << 0x28;
            case 2:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 9) << 0x30;
            case 1:
              uVar6 = uVar6 | (ulong)(byte)*puVar1 << 0x38;
            }
          }
          else {
            uVar6 = *puVar1;
            uVar6 = (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                    (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                    (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
          }
          puVar14 = puVar1;
          if (uVar6 >> 0x10 != 0x6b5f74797065) {
            if ((char)(uVar6 >> 0x38) != 'k') goto LAB_001189b6;
            if (1 < (long)uVar7) {
              bVar2 = *(byte *)((long)buf + 9);
              if (ctx->unquoted == 0) {
                if (bVar2 == 0x22) {
                  pbVar16 = (byte *)((long)buf + 10);
                  goto LAB_00118673;
                }
              }
              else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                pbVar16 = (byte *)((long)buf + 9);
                ctx->unquoted = 0;
LAB_00118673:
                if ((long)end - (long)pbVar16 < 2) {
LAB_0011878d:
                  pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
                }
                else if ((char)*pbVar16 < '!') {
                  if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_0011878d;
                  pbVar16 = pbVar16 + 1;
                }
                if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                  puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
                }
                else {
                  puVar14 = (ulong *)(pbVar16 + 1);
                  if ((long)end - (long)puVar14 < 2) {
LAB_00118974:
                    puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                  }
                  else if ((char)(byte)*puVar14 < '!') {
                    if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_00118974;
                    puVar14 = (ulong *)(pbVar16 + 2);
                  }
                }
              }
            }
            if (puVar1 == puVar14) goto LAB_001189b6;
            sVar8 = 2;
            fVar13 = 5;
            goto LAB_001189a0;
          }
          if (6 < (long)uVar7) {
            bVar2 = *(byte *)((long)buf + 0xe);
            if (ctx->unquoted == 0) {
              if (bVar2 == 0x22) {
                pbVar16 = (byte *)((long)buf + 0xf);
                goto LAB_00118376;
              }
            }
            else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
              pbVar16 = (byte *)((long)buf + 0xe);
              ctx->unquoted = 0;
LAB_00118376:
              if ((long)end - (long)pbVar16 < 2) {
LAB_00118411:
                pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
              }
              else if ((char)*pbVar16 < '!') {
                if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_00118411;
                pbVar16 = pbVar16 + 1;
              }
              if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
              }
              else {
                puVar14 = (ulong *)(pbVar16 + 1);
                if ((long)end - (long)puVar14 < 2) {
LAB_00118887:
                  puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                }
                else if ((char)(byte)*puVar14 < '!') {
                  if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_00118887;
                  puVar14 = (ulong *)(pbVar16 + 2);
                }
              }
            }
          }
          if (puVar1 != puVar14) {
            sVar8 = 2;
            fVar13 = 5;
            type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_4;
            goto LAB_0011896c;
          }
        }
        else if (uVar6 == 0x6d61696e5f636861) {
          puVar1 = (ulong *)((long)buf + 8);
          uVar7 = (long)end - (long)puVar1;
          if (uVar7 < 8) {
            uVar6 = 0;
            switch(uVar7) {
            case 7:
              uVar6 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
            case 6:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xd) << 0x10;
            case 5:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xc) << 0x18;
            case 4:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 0xb) << 0x20;
            case 3:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 10) << 0x28;
            case 2:
              uVar6 = uVar6 | (long)(char)*(byte *)((long)buf + 9) << 0x30;
            case 1:
              uVar6 = uVar6 | (ulong)(byte)*puVar1 << 0x38;
            }
          }
          else {
            uVar6 = *puVar1;
            uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                    (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                    (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                    (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
          }
          if (uVar6 == 0x7261637465725f74) {
            puVar1 = (ulong *)((long)buf + 0x10);
            uVar7 = (long)end - (long)puVar1;
            if (uVar7 < 8) {
              uVar12 = 0;
              uVar10 = 0;
              uVar11 = 0;
              uVar9 = 0;
              switch(uVar7) {
              case 7:
              case 6:
              case 5:
              case 4:
                uVar12 = (uint)(char)*(byte *)((long)buf + 0x13);
              case 3:
                uVar10 = uVar12 | (uint)((ulong)((long)(char)*(byte *)((long)buf + 0x12) << 0x28) >>
                                        0x20);
              case 2:
                uVar11 = uVar10 | (uint)((ulong)((long)(char)*(byte *)((long)buf + 0x11) << 0x30) >>
                                        0x20);
              case 1:
                uVar9 = uVar11 | (uint)(((ulong)(byte)*puVar1 << 0x38) >> 0x20);
              }
            }
            else {
              uVar6 = *puVar1;
              uVar9 = (uint)(uVar6 >> 8) & 0xff00 | (uint)(((uVar6 & 0xff00) << 0x28) >> 0x20) |
                      (uint)((uVar6 << 0x38) >> 0x20);
            }
            puVar14 = puVar1;
            if (uVar9 >> 8 == 0x797065) {
              if (3 < (long)uVar7) {
                bVar2 = *(byte *)((long)buf + 0x13);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    pbVar16 = (byte *)((long)buf + 0x14);
                    goto LAB_00118630;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  pbVar16 = (byte *)((long)buf + 0x13);
                  ctx->unquoted = 0;
LAB_00118630:
                  if ((long)end - (long)pbVar16 < 2) {
LAB_00118706:
                    pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
                  }
                  else if ((char)*pbVar16 < '!') {
                    if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_00118706;
                    pbVar16 = pbVar16 + 1;
                  }
                  if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                    puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
                  }
                  else {
                    puVar14 = (ulong *)(pbVar16 + 1);
                    if ((long)end - (long)puVar14 < 2) {
LAB_00118938:
                      puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                    }
                    else if ((char)(byte)*puVar14 < '!') {
                      if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_00118938;
                      puVar14 = (ulong *)(pbVar16 + 2);
                    }
                  }
                }
              }
              if (puVar1 != puVar14) {
                sVar8 = 0;
                fVar13 = 1;
                type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_3;
                goto LAB_0011896c;
              }
            }
          }
          else {
            puVar14 = puVar1;
            if ((uVar6 & 0xffffffffffff0000) == 0x7261637465720000) {
              if (6 < (long)uVar7) {
                bVar2 = *(byte *)((long)buf + 0xe);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    pbVar16 = (byte *)((long)buf + 0xf);
                    goto LAB_001185ed;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  pbVar16 = (byte *)((long)buf + 0xe);
                  ctx->unquoted = 0;
LAB_001185ed:
                  if ((long)end - (long)pbVar16 < 2) {
LAB_001186a7:
                    pbVar16 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar16,end);
                  }
                  else if ((char)*pbVar16 < '!') {
                    if ((*pbVar16 != 0x20) || ((char)pbVar16[1] < '!')) goto LAB_001186a7;
                    pbVar16 = pbVar16 + 1;
                  }
                  if ((pbVar16 == (byte *)end) || (*pbVar16 != 0x3a)) {
                    puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar16,end,4);
                  }
                  else {
                    puVar14 = (ulong *)(pbVar16 + 1);
                    if ((long)end - (long)puVar14 < 2) {
LAB_00118909:
                      puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                    }
                    else if ((char)(byte)*puVar14 < '!') {
                      if (((byte)*puVar14 != 0x20) || ((char)pbVar16[2] < '!')) goto LAB_00118909;
                      puVar14 = (ulong *)(pbVar16 + 2);
                    }
                  }
                }
              }
              if (puVar1 != puVar14) {
                sVar8 = 0;
                fVar13 = 1;
                goto LAB_001189a0;
              }
            }
          }
        }
LAB_001189b6:
        pcVar5 = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar14,end);
      }
LAB_001189be:
      buf = flatcc_json_parser_object_end(ctx,pcVar5,end,&more);
    } while (more != 0);
  }
  if (ctx->error == 0) {
    buf = flatcc_json_parser_finalize_unions(ctx,buf,end,h_unions);
    fVar4 = flatcc_builder_end_table(ctx->ctx);
    *local_38 = fVar4;
    if (fVar4 != 0) {
      return (char *)(ulong *)buf;
    }
  }
LAB_00117730:
  pcVar5 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar5;
}

Assistant:

static const char *Fantasy_Movie_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 10)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 5, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6368617261637465) { /* branch "characte" */
            if (w == 0x616e7461676f6e69) { /* descend "antagoni" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x73745f7479706500) { /* "st_type" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                    if (mark != buf) {
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                Fantasy_Character_parse_json_enum,
                                monster_test_local_Fantasy_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        buf = flatcc_json_parser_union_type(ctx, buf, end, 1, 3, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "st_type" */
                    if ((w & 0xffff000000000000) == 0x7374000000000000) { /* "st" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 1, 3, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "st" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "st" */
                } /* "st_type" */
            } else { /* descend "antagoni" */
                if (w == 0x63616d656f5f7479) { /* descend "cameo_ty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffff000000000000) == 0x7065000000000000) { /* "pe" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type(ctx, buf, end, 3, 7, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "pe" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "pe" */
                } else { /* descend "cameo_ty" */
                    if ((w & 0xffffffffff000000) == 0x63616d656f000000) { /* "cameo" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 3, 7, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "cameo" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "cameo" */
                } /* descend "cameo_ty" */
            } /* descend "antagoni" */
        } else { /* branch "characte" */
            if (w < 0x6d61696e5f636861) { /* branch "main_cha" */
                if (w == 0x6368617261637465) { /* descend "characte" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffffffffff00) == 0x72735f7479706500) { /* "rs_type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 4, 9, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union, Fantasy_Character_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "rs_type" */
                        if ((w & 0xffff000000000000) == 0x7273000000000000) { /* "rs" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union_vector(ctx, buf, end, 4, 9, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "rs" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "rs" */
                    } /* "rs_type" */
                } else { /* descend "characte" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "characte" */
            } else { /* branch "main_cha" */
                if (w == 0x6d61696e5f636861) { /* descend "main_cha" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if (w == 0x7261637465725f74) { /* descend "racter_t" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffff0000000000) == 0x7970650000000000) { /* "ype" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 0, 1, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "ype" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "ype" */
                    } else { /* descend "racter_t" */
                        if ((w & 0xffffffffffff0000) == 0x7261637465720000) { /* "racter" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union(ctx, buf, end, 0, 1, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "racter" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "racter" */
                    } /* descend "racter_t" */
                } else { /* descend "main_cha" */
                    if (w == 0x736964655f6b6963) { /* descend "side_kic" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffffffffff0000) == 0x6b5f747970650000) { /* "k_type" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 2, 5, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "k_type" */
                            if ((w & 0xff00000000000000) == 0x6b00000000000000) { /* "k" */
                                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                                if (mark != buf) {
                                    buf = flatcc_json_parser_union(ctx, buf, end, 2, 5, h_unions, Fantasy_Character_parse_json_union);
                                } else {
                                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                                }
                            } else { /* "k" */
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            } /* "k" */
                        } /* "k_type" */
                    } else { /* descend "side_kic" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* descend "side_kic" */
                } /* descend "main_cha" */
            } /* branch "main_cha" */
        } /* branch "characte" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}